

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsNatural(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x115,"Vec_Ptr_t *Abc_NtkDfsNatural(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkObjNum(pNtk);
  p = Vec_PtrAlloc(iVar1);
  Abc_NtkIncrementTravId(pNtk);
  pAVar2 = Abc_AigConst1(pNtk);
  Abc_NodeSetTravIdCurrent(pAVar2);
  Vec_PtrPush(p,pAVar2);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_2c);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1)
      {
        pAVar3 = Abc_ObjFanin(pAVar2,local_30);
        iVar1 = Abc_ObjIsCi(pAVar3);
        if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar3), iVar1 == 0)) {
          Abc_NodeSetTravIdCurrent(pAVar3);
          Vec_PtrPush(p,pAVar3);
        }
      }
      Vec_PtrPush(p,pAVar2);
      for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1
          ) {
        pAVar3 = Abc_ObjFanout(pAVar2,local_30);
        iVar1 = Abc_ObjIsCo(pAVar3);
        if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar3), iVar1 == 0)) {
          Abc_NodeSetTravIdCurrent(pAVar3);
          Vec_PtrPush(p,pAVar3);
        }
      }
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsNatural( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    // add the constant-1 nodes
    pObj = Abc_AigConst1(pNtk);
    Abc_NodeSetTravIdCurrent( pObj );
    Vec_PtrPush( vNodes, pObj );
    // add the CIs/nodes/COs in the topological order
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check the fanins and add CIs
        Abc_ObjForEachFanin( pObj, pNext, k )
            if ( Abc_ObjIsCi(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
        // add the node
        Vec_PtrPush( vNodes, pObj );
        // check the fanouts and add COs
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( Abc_ObjIsCo(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
    }
    return vNodes;
}